

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O2

void sesschan_notify_remote_exit(Seat *seat)

{
  Seat *ctx;
  SeatVtable *pSVar1;
  int iVar2;
  undefined4 uVar3;
  ptrlen pVar4;
  ptrlen pVar5;
  char *sigmsg;
  char *local_30;
  
  pSVar1 = seat[0xac].vt;
  if (pSVar1 == (SeatVtable *)0x0) {
    return;
  }
  ctx = seat + -6;
  if (*(char *)&(seat[0xb4].vt)->stripctrl_new == '\0') {
    pVar4 = pty_backend_exit_signame((Backend *)pSVar1,&local_30);
    if (pVar4.len != 0) {
      if (local_30 == (char *)0x0) {
        local_30 = dupstr("");
      }
      pSVar1 = ctx->vt;
      pVar5 = ptrlen_from_asciz(local_30);
      (**(code **)(pSVar1->output + 0x40))(pSVar1,pVar4.ptr,pVar4.len,0,pVar5.ptr,pVar5.len);
      safefree(local_30);
      goto LAB_001151d4;
    }
    safefree(local_30);
  }
  else {
    iVar2 = pty_backend_exit_signum((Backend *)pSVar1);
    if (-1 < iVar2) {
      (**(code **)(ctx->vt->output + 0x48))(ctx->vt,iVar2,0,"",0);
      goto LAB_001151d4;
    }
  }
  pSVar1 = seat[-6].vt;
  uVar3 = (**(code **)((seat[0xac].vt)->output + 0x48))();
  (**(code **)(pSVar1->output + 0x38))(pSVar1,uVar3);
LAB_001151d4:
  *(undefined1 *)((long)&seat[0xa6].vt + 2) = 1;
  queue_toplevel_callback(sesschan_check_close_callback,ctx);
  return;
}

Assistant:

static void sesschan_notify_remote_exit(Seat *seat)
{
    sesschan *sess = container_of(seat, sesschan, seat);

    if (!sess->backend)
        return;

    bool got_signal = false;
    if (!sess->ssc->exit_signal_numeric) {
        char *sigmsg;
        ptrlen signame = pty_backend_exit_signame(sess->backend, &sigmsg);

        if (signame.len) {
            if (!sigmsg)
                sigmsg = dupstr("");

            sshfwd_send_exit_signal(
                sess->c, signame, false, ptrlen_from_asciz(sigmsg));

            got_signal = true;
        }

        sfree(sigmsg);
    } else {
        int signum = pty_backend_exit_signum(sess->backend);

        if (signum >= 0) {
            sshfwd_send_exit_signal_numeric(sess->c, signum, false,
                                            PTRLEN_LITERAL(""));
            got_signal = true;
        }
    }

    if (!got_signal)
        sshfwd_send_exit_status(sess->c, backend_exitcode(sess->backend));

    sess->seen_exit = true;
    queue_toplevel_callback(sesschan_check_close_callback, sess);
}